

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  double dVar1;
  vec<1U,_float> *pvVar2;
  row_vec *prVar3;
  float *pfVar4;
  vec<1U,_float> *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float total_variance;
  double right_dist2;
  double left_dist2;
  vec<1U,_float> *v_5;
  uint i_6;
  double right_ttsum;
  double left_ttsum;
  vec<1U,_float> new_right_child_1;
  vec<1U,_float> new_left_child_1;
  uint total_loops;
  uint cMaxLoops;
  float right_variance;
  float left_variance;
  float prev_total_variance;
  uint64 right_weight;
  uint64 left_weight;
  double t;
  float weight_1;
  vec<1U,_float> *v_4;
  uint i_5;
  double right_weight_1;
  double left_weight_1;
  vec<1U,_float> new_right_child;
  vec<1U,_float> new_left_child;
  uint j;
  double sum;
  uint i_4;
  double max_sum;
  vec<1U,_float> x_2;
  uint iter;
  vec<1U,_float> axis;
  uint y_1;
  uint x_1;
  float divider;
  uint y;
  uint x;
  vec<1U,_float> w;
  vec<1U,_float> *v_3;
  uint i_3;
  matrix<1U,_1U,_float> covar;
  uint N;
  vec<1U,_float> right_child;
  vec<1U,_float> left_child;
  double dist_1;
  vec<1U,_float> *v_2;
  uint i_2;
  double opposite_dist;
  vec<1U,_float> opposite;
  double dist;
  vec<1U,_float> *v_1;
  uint i_1;
  double furthest_dist;
  vec<1U,_float> furthest;
  float variance;
  uint weight;
  vec<1U,_float> *v;
  uint i;
  double ttsum;
  uint64 total_weight;
  vec<1U,_float> centroid;
  double weightedDotProducts [64];
  vec<1U,_float> weightedVectors [64];
  float in_stack_fffffffffffffa78;
  float in_stack_fffffffffffffa7c;
  float in_stack_fffffffffffffa80;
  float in_stack_fffffffffffffa84;
  vec<1U,_float> *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  float local_544;
  double local_540;
  float local_520;
  float local_504;
  float local_4ec;
  vec<1U,_float> *local_4d0;
  uint local_4a4;
  double local_4a0;
  double local_498;
  vec<1U,_float> local_48c;
  vec<1U,_float> local_488;
  uint local_484;
  undefined4 local_480;
  float local_47c;
  float local_478;
  float local_474;
  ulong local_470;
  ulong local_468;
  vec<1U,_float> local_45c;
  vec<1U,_float> local_458;
  vec<1U,_float> local_454;
  double local_450;
  float local_444;
  long local_440;
  uint local_434;
  double local_430;
  double local_428;
  vec<1U,_float> local_41c;
  vec<1U,_float> local_418;
  uint local_414;
  double local_410;
  uint local_404;
  double local_400;
  vec<1U,_float> local_3f8;
  uint local_3f4;
  vec<1U,_float> local_3f0;
  uint local_3ec;
  uint local_3e8;
  float local_3e4;
  uint local_3e0;
  uint local_3dc;
  vec<1U,_float> local_3d8;
  vec<1U,_float> local_3d4;
  vec<1U,_float> *local_3d0;
  uint local_3c4;
  matrix<1U,_1U,_float> local_3c0;
  undefined4 local_3bc;
  vec<1U,_float> local_3b4 [2];
  vec<1U,_float> local_3ac;
  double local_3a8;
  vec<1U,_float> *local_3a0;
  uint local_394;
  double local_390;
  vec<1U,_float> local_384;
  double local_380;
  vec<1U,_float> *local_378;
  uint local_36c;
  double local_368;
  vec<1U,_float> local_360;
  float local_35c;
  vec<1U,_float> local_358;
  uint local_354;
  long local_350;
  uint local_344;
  double local_340;
  ulong local_338;
  vec<1U,_float> local_32c;
  double adStack_328 [64];
  vec<1U,_float> local_128 [64];
  vec<1U,_float> avStack_28 [2];
  vec<1U,_float> *local_20;
  uint local_14;
  long local_10;
  long local_8;
  
  local_4d0 = local_128;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    vec<1U,_float>::vec(local_4d0);
    local_4d0 = local_4d0 + 1;
  } while (local_4d0 != avStack_28);
  vec<1U,_float>::vec((vec<1U,_float> *)
                      CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                      (eClear)in_stack_fffffffffffffa7c);
  local_338 = 0;
  local_340 = 0.0;
  for (local_344 = 0; dVar1 = local_340, local_344 < local_14; local_344 = local_344 + 1) {
    local_350 = local_8 + (ulong)local_344 * 4;
    local_354 = *(uint *)(local_10 + (ulong)local_344 * 4);
    operator*(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
    vec<1U,_float>::operator=(local_128 + local_344,&local_358);
    vec<1U,_float>::operator+=(&local_32c,local_128 + local_344);
    local_338 = local_338 + local_354;
    fVar5 = vec<1U,_float>::dot((vec<1U,_float> *)
                                CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                                (vec<1U,_float> *)
                                CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    adStack_328[local_344] = (double)(fVar5 * (float)local_354);
    local_340 = adStack_328[local_344] + local_340;
  }
  fVar5 = vec<1U,_float>::dot((vec<1U,_float> *)
                              CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                              (vec<1U,_float> *)
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
  local_4ec = (float)local_338;
  local_35c = (float)(dVar1 - (double)(fVar5 / local_4ec));
  local_504 = (float)local_338;
  vec<1U,_float>::operator*=(&local_32c,1.0 / local_504);
  pvVar2 = vec<1U,_float>::operator=(local_20 + 1,&local_32c);
  vec<1U,_float>::operator=(local_20,pvVar2);
  if ((0.0 < local_35c) && (local_14 != 1)) {
    vec<1U,_float>::vec(&local_360);
    local_368 = -1.0;
    for (local_36c = 0; local_36c < local_14; local_36c = local_36c + 1) {
      local_378 = (vec<1U,_float> *)(local_8 + (ulong)local_36c * 4);
      fVar5 = vec<1U,_float>::squared_distance(local_378,&local_32c);
      local_380 = (double)fVar5;
      if (local_368 < local_380) {
        local_368 = local_380;
        vec<1U,_float>::operator=(&local_360,local_378);
      }
    }
    vec<1U,_float>::vec(&local_384);
    local_390 = -1.0;
    for (local_394 = 0; local_394 < local_14; local_394 = local_394 + 1) {
      local_3a0 = (vec<1U,_float> *)(local_8 + (ulong)local_394 * 4);
      fVar5 = vec<1U,_float>::squared_distance(local_3a0,&local_360);
      local_3a8 = (double)fVar5;
      if (local_390 < local_3a8) {
        local_390 = local_3a8;
        vec<1U,_float>::operator=(&local_384,local_3a0);
      }
    }
    operator+((vec<1U,_float> *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
              (vec<1U,_float> *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    operator*(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
    operator+((vec<1U,_float> *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
              (vec<1U,_float> *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    operator*(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
    if (2 < local_14) {
      local_3bc = 1;
      matrix<1U,_1U,_float>::matrix
                ((matrix<1U,_1U,_float> *)
                 CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      matrix<1U,_1U,_float>::clear
                ((matrix<1U,_1U,_float> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
      for (local_3c4 = 0; local_3c4 < local_14; local_3c4 = local_3c4 + 1) {
        operator-((vec<1U,_float> *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                  (vec<1U,_float> *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        local_3d0 = &local_3d4;
        operator*(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
        for (local_3dc = 0; local_3dc == 0; local_3dc = local_3dc + 1) {
          for (local_3e0 = local_3dc; local_3e0 == 0; local_3e0 = local_3e0 + 1) {
            prVar3 = matrix<1U,_1U,_float>::operator[](&local_3c0,local_3dc);
            pfVar4 = vec<1U,_float>::operator[](prVar3,local_3e0);
            fVar5 = *pfVar4;
            fVar6 = vec<1U,_float>::operator[](local_3d0,local_3dc);
            fVar7 = vec<1U,_float>::operator[](&local_3d8,local_3e0);
            prVar3 = matrix<1U,_1U,_float>::operator[](&local_3c0,local_3dc);
            pfVar4 = vec<1U,_float>::operator[](prVar3,local_3e0);
            *pfVar4 = fVar5 + fVar6 * fVar7;
          }
        }
      }
      local_520 = (float)local_338;
      local_3e4 = local_520;
      for (local_3e8 = 0; local_3e8 == 0; local_3e8 = local_3e8 + 1) {
        for (local_3ec = local_3e8; fVar5 = local_3e4, local_3ec == 0; local_3ec = local_3ec + 1) {
          prVar3 = matrix<1U,_1U,_float>::operator[](&local_3c0,local_3e8);
          pfVar4 = vec<1U,_float>::operator[](prVar3,local_3ec);
          *pfVar4 = *pfVar4 / fVar5;
          prVar3 = matrix<1U,_1U,_float>::operator[](&local_3c0,local_3e8);
          pfVar4 = vec<1U,_float>::operator[](prVar3,local_3ec);
          fVar5 = *pfVar4;
          prVar3 = matrix<1U,_1U,_float>::operator[](&local_3c0,local_3ec);
          pfVar4 = vec<1U,_float>::operator[](prVar3,local_3e8);
          *pfVar4 = fVar5;
        }
      }
      vec<1U,_float>::vec((vec<1U,_float> *)
                          CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          in_stack_fffffffffffffa7c);
      for (local_3f4 = 0; local_3f4 < 10; local_3f4 = local_3f4 + 1) {
        vec<1U,_float>::vec(&local_3f8);
        local_400 = 0.0;
        for (local_404 = 0; local_404 == 0; local_404 = local_404 + 1) {
          local_410 = 0.0;
          for (local_414 = 0; local_414 == 0; local_414 = local_414 + 1) {
            pfVar4 = vec<1U,_float>::operator[](&local_3f0,0);
            fVar5 = *pfVar4;
            prVar3 = matrix<1U,_1U,_float>::operator[](&local_3c0,local_404);
            pfVar4 = vec<1U,_float>::operator[](prVar3,local_414);
            local_410 = (double)(fVar5 * *pfVar4) + local_410;
          }
          fVar5 = (float)local_410;
          pfVar4 = vec<1U,_float>::operator[](&local_3f8,local_404);
          *pfVar4 = fVar5;
          if (local_404 == 0) {
            local_540 = local_410;
          }
          else {
            local_540 = math::maximum<double>(local_400,local_410);
          }
          local_400 = local_540;
        }
        if ((local_400 != 0.0) || (NAN(local_400))) {
          vec<1U,_float>::operator*=(&local_3f8,(float)(1.0 / local_400));
        }
        vec<1U,_float>::operator=(&local_3f0,&local_3f8);
      }
      vec<1U,_float>::normalize
                ((vec<1U,_float> *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 in_stack_fffffffffffffa88);
      vec<1U,_float>::vec((vec<1U,_float> *)
                          CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          in_stack_fffffffffffffa7c);
      vec<1U,_float>::vec((vec<1U,_float> *)
                          CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          in_stack_fffffffffffffa7c);
      local_428 = 0.0;
      local_430 = 0.0;
      for (local_434 = 0; local_434 < local_14; local_434 = local_434 + 1) {
        local_440 = local_8 + (ulong)local_434 * 4;
        local_444 = (float)*(uint *)(local_10 + (ulong)local_434 * 4);
        operator-((vec<1U,_float> *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                  (vec<1U,_float> *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        fVar5 = operator*(&local_454,&local_3f0);
        local_450 = (double)fVar5;
        if (0.0 <= local_450) {
          vec<1U,_float>::operator+=(&local_41c,local_128 + local_434);
          local_430 = (double)local_444 + local_430;
        }
        else {
          vec<1U,_float>::operator+=(&local_418,local_128 + local_434);
          local_428 = (double)local_444 + local_428;
        }
      }
      if ((0.0 < local_428) && (0.0 < local_430)) {
        operator*(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
        vec<1U,_float>::operator=(&local_3ac,&local_458);
        operator*(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
        vec<1U,_float>::operator=(local_3b4,&local_45c);
      }
    }
    local_468 = 0;
    local_470 = 0;
    local_474 = 1e+10;
    local_478 = 0.0;
    local_47c = 0.0;
    local_480 = 0x400;
    for (local_484 = 0; local_484 < 0x400; local_484 = local_484 + 1) {
      vec<1U,_float>::vec((vec<1U,_float> *)
                          CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          (eClear)in_stack_fffffffffffffa7c);
      vec<1U,_float>::vec((vec<1U,_float> *)
                          CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          (eClear)in_stack_fffffffffffffa7c);
      local_498 = 0.0;
      local_4a0 = 0.0;
      local_468 = 0;
      local_470 = 0;
      for (local_4a4 = 0; local_4a4 < local_14; local_4a4 = local_4a4 + 1) {
        pvVar2 = (vec<1U,_float> *)(local_8 + (ulong)local_4a4 * 4);
        fVar5 = vec<1U,_float>::squared_distance(&local_3ac,pvVar2);
        fVar6 = vec<1U,_float>::squared_distance(local_3b4,pvVar2);
        if (fVar6 <= fVar5) {
          vec<1U,_float>::operator+=(&local_48c,local_128 + local_4a4);
          local_4a0 = adStack_328[local_4a4] + local_4a0;
          local_470 = *(uint *)(local_10 + (ulong)local_4a4 * 4) + local_470;
        }
        else {
          vec<1U,_float>::operator+=(&local_488,local_128 + local_4a4);
          local_498 = adStack_328[local_4a4] + local_498;
          local_468 = *(uint *)(local_10 + (ulong)local_4a4 * 4) + local_468;
        }
      }
      if (local_468 == 0) {
        return;
      }
      if (local_470 == 0) {
        return;
      }
      fVar5 = vec<1U,_float>::dot((vec<1U,_float> *)
                                  CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                                  (vec<1U,_float> *)
                                  CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      local_544 = (float)local_468;
      local_478 = (float)(local_498 - (double)(fVar5 / local_544));
      fVar5 = vec<1U,_float>::dot((vec<1U,_float> *)
                                  CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                                  (vec<1U,_float> *)
                                  CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      local_47c = (float)(local_4a0 - (double)(fVar5 / (float)local_470));
      in_stack_fffffffffffffa80 = (float)(long)local_468;
      in_stack_fffffffffffffa84 = (float)local_468;
      vec<1U,_float>::operator*=(&local_488,1.0 / in_stack_fffffffffffffa84);
      in_stack_fffffffffffffa78 = (float)(long)local_470;
      in_stack_fffffffffffffa7c = (float)local_470;
      vec<1U,_float>::operator*=(&local_48c,1.0 / in_stack_fffffffffffffa7c);
      vec<1U,_float>::operator=(&local_3ac,&local_488);
      vec<1U,_float>::operator=(local_3b4,&local_48c);
      fVar5 = local_478 + local_47c;
      if ((fVar5 < 1e-05) || ((local_474 - fVar5) / fVar5 < 1e-05)) break;
      local_474 = fVar5;
    }
    vec<1U,_float>::operator=(local_20,&local_3ac);
    vec<1U,_float>::operator=(local_20 + 1,local_3b4);
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2]) {
  VectorType weightedVectors[64];
  double weightedDotProducts[64];
  VectorType centroid(cClear);
  uint64 total_weight = 0;
  double ttsum = 0.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    const uint weight = weights[i];
    weightedVectors[i] = v * (float)weight;
    centroid += weightedVectors[i];
    total_weight += weight;
    weightedDotProducts[i] = v.dot(v) * weight;
    ttsum += weightedDotProducts[i];
  }
  float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
  centroid *= (1.0f / total_weight);
  result[0] = result[1] = centroid;
  if (variance <= 0.0f || size == 1)
    return;
  VectorType furthest;
  double furthest_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(centroid);
    if (dist > furthest_dist) {
      furthest_dist = dist;
      furthest = v;
    }
  }
  VectorType opposite;
  double opposite_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(furthest);
    if (dist > opposite_dist) {
      opposite_dist = dist;
      opposite = v;
    }
  }
  VectorType left_child((furthest + centroid) * .5f);
  VectorType right_child((opposite + centroid) * .5f);
  if (size > 2) {
    const uint N = VectorType::num_elements;
    matrix<N, N, float> covar;
    covar.clear();
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i] - centroid;
      const VectorType w = v * (float)weights[i];
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
      }
    }
    float divider = (float)total_weight;
    for (uint x = 0; x < N; x++) {
      for (uint y = x; y < N; y++) {
        covar[x][y] /= divider;
        covar[y][x] = covar[x][y];
      }
    }
    VectorType axis(1.0f);
    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;
      double max_sum = 0;
      for (uint i = 0; i < N; i++) {
        double sum = 0;
        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];
        x[i] = (float)sum;
        max_sum = i ? math::maximum(max_sum, sum) : sum;
      }
      if (max_sum != 0.0f)
        x *= (float)(1.0f / max_sum);
      axis = x;
    }
    axis.normalize();
    VectorType new_left_child(0.0f);
    VectorType new_right_child(0.0f);
    double left_weight = 0.0f;
    double right_weight = 0.0f;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      const float weight = (float)weights[i];
      double t = (v - centroid) * axis;
      if (t < 0.0f) {
        new_left_child += weightedVectors[i];
        left_weight += weight;
      } else {
        new_right_child += weightedVectors[i];
        right_weight += weight;
      }
    }
    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child = new_left_child * (float)(1.0f / left_weight);
      right_child = new_right_child * (float)(1.0f / right_weight);
    }
  }
  uint64 left_weight = 0;
  uint64 right_weight = 0;
  float prev_total_variance = 1e+10f;
  float left_variance = 0.0f;
  float right_variance = 0.0f;
  const uint cMaxLoops = 1024;
  for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
    VectorType new_left_child(cClear);
    VectorType new_right_child(cClear);
    double left_ttsum = 0.0f;
    double right_ttsum = 0.0f;
    left_weight = 0;
    right_weight = 0;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      if (left_dist2 < right_dist2) {
        new_left_child += weightedVectors[i];
        left_ttsum += weightedDotProducts[i];
        left_weight += weights[i];
      } else {
        new_right_child += weightedVectors[i];
        right_ttsum += weightedDotProducts[i];
        right_weight += weights[i];
      }
    }
    if ((!left_weight) || (!right_weight))
      return;
    left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
    right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
    new_left_child *= (1.0f / left_weight);
    new_right_child *= (1.0f / right_weight);
    left_child = new_left_child;
    right_child = new_right_child;
    float total_variance = left_variance + right_variance;
    if (total_variance < .00001f)
      break;
    if (((prev_total_variance - total_variance) / total_variance) < .00001f)
      break;
    prev_total_variance = total_variance;
  }
  result[0] = left_child;
  result[1] = right_child;
}